

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# oonf_telnet.c
# Opt level: O0

void oonf_telnet_stop(oonf_telnet_data *data,_Bool print_prompt)

{
  _Bool print_prompt_local;
  oonf_telnet_data *data_local;
  oonf_telnet_data *__tempptr;
  oonf_telnet_session *session;
  
  _call_stop_handler(data);
  data->show_echo = true;
  if (print_prompt) {
    abuf_puts(data->out,"> ");
  }
  if ((*(int *)((long)&data[-1].cleanup_list.prev + 4) != 0) &&
     (*(int *)((long)&data[-1].cleanup_list.prev + 4) != 3)) {
    oonf_stream_flush((oonf_stream_session *)(data + -3));
  }
  return;
}

Assistant:

void
oonf_telnet_stop(struct oonf_telnet_data *data, bool print_prompt) {
  _call_stop_handler(data);
  data->show_echo = true;
  if (print_prompt) {
    abuf_puts(data->out, "> ");
  }
  oonf_telnet_flush_session(data);
}